

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall BasicBlock::MergePredBlocksValueMaps(BasicBlock *this,GlobOpt *globOpt)

{
  GlobOptBlockData *fromData;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar1;
  int iVar2;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  JitArenaAllocator *pJVar3;
  Loop *pLVar4;
  PathDependentInfo *pPVar5;
  Type pSVar6;
  Type pFVar7;
  SymTable *pSVar8;
  Type pBVar9;
  long lVar10;
  code *pcVar11;
  Type pDVar12;
  bool bVar13;
  bool bVar14;
  uint uVar15;
  uint functionId;
  undefined4 *puVar16;
  Type *ppFVar17;
  ArenaMemoryData *pAVar18;
  BailOutInfo *pBVar19;
  Value *pVVar20;
  _func_void *p_Var21;
  DictionaryStats *pDVar22;
  StackSym *pSVar23;
  ValueInfo *pVVar24;
  StackSym *pSVar25;
  DictionaryStats *pDVar26;
  BasicBlock *pBVar27;
  Type *ppFVar28;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  BasicBlock *toBlockContext;
  BVSparse<Memory::JitArenaAllocator> *pBVar29;
  long *plVar30;
  Type pJVar31;
  NodeBase **ppNVar32;
  BVSparse<Memory::JitArenaAllocator> *pBVar33;
  BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_03;
  Loop *currentLoop;
  Loop *pLVar34;
  Type_conflict pBVar35;
  BVSparseNode *pBVar36;
  ValueInfo *pVVar37;
  Sym *pSVar38;
  _func_void *p_Var39;
  DictionaryStats *pDVar40;
  ulong uVar41;
  ArenaMemoryData *pAVar42;
  Type_conflict pBVar43;
  BVSparseNode *pBVar44;
  Sym *pSVar45;
  ulong uVar46;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar47;
  BasicBlock *pBVar48;
  Loop *loop;
  undefined1 auVar49 [8];
  PathDependentInfoToRestore infoToRestore;
  undefined1 local_250 [8];
  EditingIterator iter;
  GlobOptBlockData blockData;
  undefined1 auStack_158 [8];
  BVSparse<Memory::JitArenaAllocator> symsNeedingLosslessIntConversion;
  Iterator __iter_1;
  BVSparse<Memory::JitArenaAllocator> symsNeedingFloatConversion;
  undefined1 auStack_f8 [8];
  SymToValueInfoMap symsRequiringCompensationToMergedValueInfoMap;
  undefined1 auStack_b8 [8];
  BVSparse<Memory::JitArenaAllocator> symsRequiringCompensation;
  undefined1 auStack_78 [8];
  BVSparse<Memory::JitArenaAllocator> symsNeedingLossyIntConversion;
  
  if ((globOpt->field_0xf4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar13 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                        ,0x132f,"(!globOpt->isCallHelper)","!globOpt->isCallHelper");
    if (!bVar13) {
LAB_004246f5:
      pcVar11 = (code *)invalidInstructionException();
      (*pcVar11)();
    }
    *puVar16 = 0;
  }
  fromData = &this->globOptData;
  iter.last = (NodeBase *)0x0;
  if ((globOpt->field_0xf4 & 0x20) != 0) {
    GlobOptBlockData::CopyBlockData((GlobOptBlockData *)&iter.last,fromData);
    return;
  }
  GlobOptBlockData::NullOutBlockData((GlobOptBlockData *)&iter.last,globOpt,globOpt->func);
  symsRequiringCompensationToMergedValueInfoMap.entries = (Type)globOpt->tempAlloc;
  symsRequiringCompensation.alloc = (Type)auStack_b8;
  auStack_b8 = (undefined1  [8])0x0;
  symsRequiringCompensation.head = (Type_conflict)0x0;
  symsRequiringCompensationToMergedValueInfoMap.alloc = (Type)auStack_f8;
  auStack_f8 = (undefined1  [8])0x0;
  symsRequiringCompensationToMergedValueInfoMap.buckets = (Type)0x0;
  pSVar1 = &this->predList;
  symsRequiringCompensation.lastFoundIndex =
       (Type_conflict)symsRequiringCompensationToMergedValueInfoMap.entries;
  auStack_78 = (undefined1  [8])pSVar1;
  symsNeedingLossyIntConversion.head = (Type_conflict)pSVar1;
  puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  bVar13 = true;
LAB_004230a3:
  if (symsNeedingLossyIntConversion.head == (Type_conflict)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar16 = 1;
    bVar14 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                        ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar14) goto LAB_004246f5;
    *puVar16 = 0;
  }
  symsNeedingLossyIntConversion.head = (symsNeedingLossyIntConversion.head)->next;
  if ((undefined1  [8])symsNeedingLossyIntConversion.head != auStack_78) {
    ppFVar17 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)auStack_78);
    pBVar48 = (*ppFVar17)->predBlock;
    if (pBVar48 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar16 = 1;
      bVar14 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x1343,"(pred)","pred");
      if (!bVar14) goto LAB_004246f5;
      *puVar16 = 0;
    }
    this_00 = (pBVar48->globOptData).callSequence;
    if ((this_00 != (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
       ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
        (this_00->super_SListNodeBase<Memory::ArenaAllocator>).next == this_00)) {
      pJVar3 = globOpt->alloc;
      SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::~SListBase(this_00);
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)pJVar3,
                 this_00,0x10);
      (pBVar48->globOptData).callSequence =
           (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    }
    if ((((this->field_0x18 & 4) != 0) && (globOpt->prePassLoop != (Loop *)0x0)) &&
       (pLVar4 = this->loop, globOpt->prePassLoop == pLVar4)) goto code_r0x004231d1;
    goto LAB_00423208;
  }
  symsNeedingLossyIntConversion.head = (Type_conflict)0x0;
  if (auStack_f8 != (undefined1  [8])0x0) {
    auVar49 = auStack_f8;
    pAVar42 = *(ArenaMemoryData **)
               &symsRequiringCompensationToMergedValueInfoMap.entries[5].
                super_DefaultHashedEntry<Sym_*,_ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<Sym_*,_ValueInfo_*>.
                super_ValueEntry<ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>_>
                .super_KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>.next;
    do {
      pAVar18 = (ArenaMemoryData *)auVar49;
      auVar49 = (undefined1  [8])pAVar18->allocatedBytes;
      pAVar18->allocatedBytes = (size_t)pAVar42;
      pAVar42 = pAVar18;
    } while (auVar49 != (undefined1  [8])0x0);
    symsRequiringCompensationToMergedValueInfoMap.buckets = (Type)0x0;
    *(ArenaMemoryData **)
     &symsRequiringCompensationToMergedValueInfoMap.entries[5].
      super_DefaultHashedEntry<Sym_*,_ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
      super_KeyValueEntry<Sym_*,_ValueInfo_*>.
      super_ValueEntry<ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>_>
      .super_KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>.next = pAVar18;
    symsRequiringCompensationToMergedValueInfoMap.alloc = (Type)auStack_f8;
  }
  if (iter.last == (NodeBase *)0x0) {
    GlobOptBlockData::InitBlockData((GlobOptBlockData *)&iter.last,globOpt,globOpt->func);
  }
  bVar13 = GlobOpt::DoObjTypeSpec(globOpt);
  if (!bVar13) {
    GlobOpt::KillAllObjectTypes(globOpt,(this->globOptData).liveFields);
  }
  GlobOptBlockData::CopyBlockData(fromData,(GlobOptBlockData *)&iter.last);
  if (globOpt->prePassLoop == (Loop *)0x0) {
    CleanUpValueMaps(this);
    JsUtil::
    BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary((BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)auStack_f8,globOpt->tempAlloc,0);
    auVar49 = auStack_b8;
    plVar30 = (long *)auStack_b8;
    do {
      plVar30 = (long *)*plVar30;
      if (plVar30 == (long *)0x0) goto LAB_00423736;
    } while (plVar30[2] == 0);
    if (plVar30 != (long *)0x0) {
      if (auStack_b8 != (undefined1  [8])0x0) {
        pSVar8 = this->func->m_symTable;
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        do {
          uVar46 = *(ulong *)((long)auVar49 + 0x10);
          if (uVar46 != 0) {
            iVar2 = *(int *)((long)auVar49 + 8);
            uVar41 = 0;
            if (uVar46 != 0) {
              for (; (uVar46 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
              }
            }
            do {
              BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar41);
              auStack_78 = (undefined1  [8])SymTable::Find(pSVar8,(BVIndex)uVar41 + iVar2);
              if (auStack_78 == (undefined1  [8])0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar16 = 1;
                bVar13 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                    ,0x13b1,"(sym)","sym");
                if (!bVar13) goto LAB_004246f5;
                *puVar16 = 0;
              }
              pVVar20 = GlobOptBlockData::FindValue
                                  ((GlobOptBlockData *)&iter.last,(Sym *)auStack_78);
              if (pVVar20 != (Value *)0x0) {
                auStack_158 = (undefined1  [8])pVVar20->valueInfo;
                bVar13 = ValueInfo::IsArrayValueInfo((ValueInfo *)auStack_158);
                if (bVar13) {
                  JsUtil::
                  BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::
                  Insert<(JsUtil::BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                            ((BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                              *)auStack_f8,(Sym **)auStack_78,(ValueInfo **)auStack_158);
                }
              }
              uVar46 = uVar46 & ~(1L << (uVar41 & 0x3f));
              lVar10 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              uVar41 = (ulong)(-(uint)(uVar46 == 0) | (uint)lVar10);
            } while (uVar46 != 0);
          }
          auVar49 = *(undefined1 (*) [8])auVar49;
        } while (auVar49 != (undefined1  [8])0x0);
      }
      if (auStack_b8 != (undefined1  [8])0x0) {
        p_Var39 = *(_func_void **)&symsRequiringCompensation.lastFoundIndex[5].startIndex;
        do {
          p_Var21 = (_func_void *)auStack_b8;
          auStack_b8 = *(undefined1 (*) [8])p_Var21;
          *(_func_void **)p_Var21 = p_Var39;
          p_Var39 = p_Var21;
        } while (auStack_b8 != (undefined1  [8])0x0);
        *(_func_void **)&symsRequiringCompensation.lastFoundIndex[5].startIndex = p_Var21;
      }
      symsRequiringCompensation.alloc = (Type)auStack_b8;
      auStack_b8 = (undefined1  [8])0x0;
      symsRequiringCompensation.head = (Type_conflict)0x0;
    }
LAB_00423736:
    if ((this->field_0x18 & 4) != 0) {
      symsRequiringCompensationToMergedValueInfoMap.stats = (Type)globOpt->tempBv;
      pDVar22 = symsRequiringCompensationToMergedValueInfoMap.stats;
      do {
        pDVar22 = pDVar22->pNext;
        if (pDVar22 == (DictionaryStats *)0x0) goto LAB_004237c5;
      } while (((Type *)&pDVar22->countOfEmptyBuckets)->word == 0);
      if (pDVar22 != (DictionaryStats *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                            ,0x13d0,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
        if (!bVar13) goto LAB_004246f5;
        *puVar16 = 0;
      }
LAB_004237c5:
      pDVar12 = symsRequiringCompensationToMergedValueInfoMap.stats;
      pLVar4 = this->loop;
      pSVar8 = this->func->m_symTable;
      pJVar3 = globOpt->alloc;
      BVSparse<Memory::JitArenaAllocator>::Or
                ((BVSparse<Memory::JitArenaAllocator> *)
                 symsRequiringCompensationToMergedValueInfoMap.stats,
                 pLVar4->likelyIntSymsUsedBeforeDefined,pLVar4->symsDefInLoop);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
                ((BVSparse<Memory::JitArenaAllocator> *)pDVar12,
                 (BVSparse<Memory::JitArenaAllocator> *)0x0);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                ((BVSparse<Memory::JitArenaAllocator> *)pDVar12,
                 (BVSparse<Memory::JitArenaAllocator> *)0x0);
      pDVar22 = pDVar12->pNext;
      if (pDVar22 != (DictionaryStats *)0x0) {
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        do {
          uVar46._0_4_ = pDVar22->countOfEmptyBuckets;
          uVar46._4_4_ = pDVar22->countOfResize;
          if (uVar46 != 0) {
            uVar15 = pDVar22->initialSize;
            uVar41 = 0;
            if (uVar46 != 0) {
              for (; (uVar46 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
              }
            }
            do {
              BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar41);
              pSVar23 = SymTable::FindStackSym(pSVar8,(BVIndex)uVar41 + uVar15);
              if (pSVar23 == (StackSym *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar16 = 1;
                bVar13 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                    ,0x13dc,"(varSym)","varSym");
                if (!bVar13) goto LAB_004246f5;
                *puVar16 = 0;
              }
              pVVar20 = GlobOptBlockData::FindValue
                                  ((GlobOptBlockData *)&iter.last,&pSVar23->super_Sym);
              if (pVVar20 == (Value *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar16 = 1;
                bVar13 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                    ,0x13de,"(value)","value");
                if (!bVar13) goto LAB_004246f5;
                *puVar16 = 0;
              }
              pVVar24 = pVVar20->valueInfo;
              bVar13 = ValueType::IsInt(&pVVar24->super_ValueType);
              if (!bVar13) {
                pVVar24 = ValueInfo::SpecializeToInt32(pVVar24,pJVar3,false);
                GlobOpt::ChangeValueInfo(globOpt,(BasicBlock *)0x0,pVVar20,pVVar24,false,false);
              }
              uVar46 = uVar46 & ~(1L << (uVar41 & 0x3f));
              lVar10 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              uVar41 = (ulong)(-(uint)(uVar46 == 0) | (uint)lVar10);
            } while (uVar46 != 0);
          }
          pDVar22 = pDVar22->pNext;
        } while (pDVar22 != (DictionaryStats *)0x0);
      }
      pDVar12 = symsRequiringCompensationToMergedValueInfoMap.stats;
      BVSparse<Memory::JitArenaAllocator>::Or
                ((BVSparse<Memory::JitArenaAllocator> *)
                 symsRequiringCompensationToMergedValueInfoMap.stats,
                 pLVar4->likelyNumberSymsUsedBeforeDefined,pLVar4->symsDefInLoop);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                ((BVSparse<Memory::JitArenaAllocator> *)pDVar12,pLVar4->forceFloat64SymsOnEntry);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
                ((BVSparse<Memory::JitArenaAllocator> *)pDVar12,
                 (BVSparse<Memory::JitArenaAllocator> *)0x0);
      pDVar22 = pDVar12->pNext;
      if (pDVar22 != (DictionaryStats *)0x0) {
        pBVar48 = pLVar4->landingPad;
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        do {
          uVar41._0_4_ = pDVar22->countOfEmptyBuckets;
          uVar41._4_4_ = pDVar22->countOfResize;
          if (uVar41 != 0) {
            uVar15 = pDVar22->initialSize;
            uVar46 = 0;
            if (uVar41 != 0) {
              for (; (uVar41 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
              }
            }
            do {
              BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar46);
              pSVar23 = SymTable::FindStackSym(pSVar8,(BVIndex)uVar46 + uVar15);
              if (pSVar23 == (StackSym *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar16 = 1;
                bVar13 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                    ,0x13ee,"(varSym)","varSym");
                if (!bVar13) goto LAB_004246f5;
                *puVar16 = 0;
              }
              pSVar25 = StackSym::GetFloat64EquivSym(pSVar23,(Func *)0x0);
              if (((pSVar25 == (StackSym *)0x0) || ((pSVar25->field_0x1a & 2) != 0)) ||
                 (bVar13 = GlobOptBlockData::IsFloat64TypeSpecialized
                                     (&pBVar48->globOptData,&pSVar23->super_Sym), !bVar13)) {
                pVVar20 = GlobOptBlockData::FindValue
                                    ((GlobOptBlockData *)&iter.last,&pSVar23->super_Sym);
                if (pVVar20 == (Value *)0x0) {
                  pVVar20 = GlobOpt::NewGenericValue(globOpt,(ValueType)0x108);
                  GlobOptBlockData::SetValue(fromData,pVVar20,&pSVar23->super_Sym);
                }
                else {
                  pVVar24 = pVVar20->valueInfo;
                  bVar13 = ValueType::IsNumber(&pVVar24->super_ValueType);
                  if (!bVar13) {
                    pVVar24 = ValueInfo::SpecializeToFloat64(pVVar24,pJVar3);
                    GlobOpt::ChangeValueInfo(globOpt,this,pVVar20,pVVar24,false,false);
                  }
                }
              }
              uVar41 = uVar41 & ~(1L << (uVar46 & 0x3f));
              lVar10 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              uVar46 = (ulong)(-(uint)(uVar41 == 0) | (uint)lVar10);
            } while (uVar41 != 0);
          }
          pDVar22 = pDVar22->pNext;
        } while (pDVar22 != (DictionaryStats *)0x0);
      }
      if ((symsRequiringCompensationToMergedValueInfoMap.stats)->pNext != (DictionaryStats *)0x0) {
        lVar10 = *(long *)&(symsRequiringCompensationToMergedValueInfoMap.stats)->
                           countOfEmptyBuckets;
        pDVar22 = (symsRequiringCompensationToMergedValueInfoMap.stats)->pNext;
        pDVar40 = *(DictionaryStats **)(lVar10 + 0x80);
        do {
          pDVar26 = pDVar22;
          pDVar22 = pDVar26->pNext;
          pDVar26->pNext = pDVar40;
          pDVar40 = pDVar26;
        } while (pDVar22 != (DictionaryStats *)0x0);
        *(DictionaryStats **)(lVar10 + 0x80) = pDVar26;
      }
      (symsRequiringCompensationToMergedValueInfoMap.stats)->pNext = (DictionaryStats *)0x0;
      (symsRequiringCompensationToMergedValueInfoMap.stats)->initialSize = 0;
      (symsRequiringCompensationToMergedValueInfoMap.stats)->finalSize = 0;
      *(Type *)&(symsRequiringCompensationToMergedValueInfoMap.stats)->itemCount =
           symsRequiringCompensationToMergedValueInfoMap.stats;
    }
    pBVar29 = globOpt->tempBv;
    do {
      pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)pBVar29->head;
      if (pBVar29 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_00423c04;
    } while (((Type *)&pBVar29->alloc)->word == 0);
    if (pBVar29 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x1413,"(globOpt->tempBv->IsEmpty())","globOpt->tempBv->IsEmpty()");
      if (!bVar13) goto LAB_004246f5;
      *puVar16 = 0;
    }
LAB_00423c04:
    pJVar3 = globOpt->tempAlloc;
    auStack_78 = (undefined1  [8])0x0;
    symsNeedingLossyIntConversion.head = (Type_conflict)0x0;
    symsNeedingLossyIntConversion.alloc = (Type)auStack_78;
    auStack_158 = (undefined1  [8])0x0;
    symsNeedingLosslessIntConversion.head = (Type_conflict)0x0;
    __iter_1.current = (NodeBase *)0x0;
    iter.super_Iterator.current = (NodeBase *)0x0;
    local_250 = (undefined1  [8])pSVar1;
    iter.super_Iterator.list =
         &pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    symsNeedingLosslessIntConversion.lastFoundIndex = (Type_conflict)pJVar3;
    symsNeedingLosslessIntConversion.alloc = (Type)auStack_158;
    symsNeedingLossyIntConversion.lastFoundIndex = (Type_conflict)pJVar3;
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while (bVar13 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                              ((EditingIterator *)local_250), bVar13) {
      ppFVar17 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)local_250);
      pBVar48 = (*ppFVar17)->predBlock;
      if ((pBVar48->loop == (Loop *)0x0) ||
         (pBVar27 = Loop::GetHeadBlock(pBVar48->loop), pBVar27 != this)) {
        if ((pBVar48->field_0x18 & 0x40) == 0) {
          toBlockContext = (BasicBlock *)0x0;
          pBVar27 = pBVar48;
        }
        else {
          pSVar47 = &pBVar48->predList;
          pSVar6 = (pBVar48->predList).
                   super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
          if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar6 == pSVar47) ||
             ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar6->next != pSVar47)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x1427,"(pred->GetPredList()->HasOne())",
                                "pred->GetPredList()->HasOne()");
            if (!bVar13) goto LAB_004246f5;
            *puVar16 = 0;
          }
          ppFVar28 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (&pSVar47->
                                 super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
          pBVar27 = (*ppFVar28)->predBlock;
          toBlockContext = pBVar48;
        }
        BVSparse<Memory::JitArenaAllocator>::Minus
                  ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,
                   (BVSparse<Memory::JitArenaAllocator> *)0x0,(pBVar27->globOptData).liveInt32Syms);
        BVSparse<Memory::JitArenaAllocator>::Minus
                  ((BVSparse<Memory::JitArenaAllocator> *)auStack_158,
                   (BVSparse<Memory::JitArenaAllocator> *)0x0,
                   (BVSparse<Memory::JitArenaAllocator> *)0x0);
        BVSparse<Memory::JitArenaAllocator>::Minus
                  (globOpt->tempBv,(pBVar27->globOptData).liveInt32Syms,
                   (pBVar27->globOptData).liveLossyInt32Syms);
        BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                  ((BVSparse<Memory::JitArenaAllocator> *)auStack_158,globOpt->tempBv);
        BVSparse<Memory::JitArenaAllocator>::Minus
                  (globOpt->tempBv,(BVSparse<Memory::JitArenaAllocator> *)0x0,
                   (pBVar27->globOptData).liveVarSyms);
        BVSparse<Memory::JitArenaAllocator>::Minus
                  ((BVSparse<Memory::JitArenaAllocator> *)&__iter_1.current,
                   (BVSparse<Memory::JitArenaAllocator> *)0x0,(pBVar27->globOptData).liveFloat64Syms
                  );
        pBVar29 = globOpt->tempBv;
        do {
          pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)pBVar29->head;
          if (pBVar29 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_00423ded;
        } while (((Type *)&pBVar29->alloc)->word == 0);
        if (pBVar29 != (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_00423e49;
LAB_00423ded:
        plVar30 = (long *)auStack_78;
        do {
          plVar30 = (long *)*plVar30;
          pJVar31 = (Type)auStack_158;
          if (plVar30 == (long *)0x0) goto LAB_00423e08;
        } while (plVar30[2] == 0);
        if (plVar30 != (long *)0x0) goto LAB_00423e49;
LAB_00423e08:
        do {
          pJVar31 = (Type)(pJVar31->super_ArenaAllocator).
                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                          super_Allocator.outOfMemoryFunc;
          if (pJVar31 == (Type)0x0) goto LAB_00423e1c;
        } while ((pJVar31->super_ArenaAllocator).
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                 super_ArenaData.bigBlocks == (BigBlock *)0x0);
        if (pJVar31 != (Type)0x0) goto LAB_00423e49;
LAB_00423e1c:
        ppNVar32 = &__iter_1.current;
        do {
          ppNVar32 = &(*ppNVar32)->next;
          if (ppNVar32 == (NodeBase **)0x0) goto LAB_00423e37;
        } while (((NodeBase *)(ppNVar32 + 2))->next == (Type)0x0);
        if (ppNVar32 != (NodeBase **)0x0) goto LAB_00423e49;
LAB_00423e37:
        if (symsRequiringCompensationToMergedValueInfoMap.size !=
            symsRequiringCompensationToMergedValueInfoMap.count) {
LAB_00423e49:
          ppFVar28 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (&(pBVar27->succList).
                                 super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
          if (((*ppFVar28)->succBlock != this) ||
             (((pBVar27->loop != (Loop *)0x0 && (pBVar27->loop->parent == this->loop)) &&
              (1 < (pBVar27->succList).
                   super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
                   count)))) {
            if (toBlockContext == (BasicBlock *)0x0) {
              this_01 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
              uVar15 = JITTimeFunctionBody::GetSourceContextId(this_01);
              this_02 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
              functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
              bVar13 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar15,functionId)
              ;
              if ((bVar13) && (globOpt->prePassLoop == (Loop *)0x0)) {
                Output::Print(L"TRACE: ");
                Output::Print(L"Inserting airlock block to convert syms to var between block %d and %d\n"
                              ,(ulong)pBVar27->number,(ulong)this->number);
                Output::Flush();
              }
              toBlockContext = FlowGraph::InsertAirlockBlock(globOpt->func->m_fg,*ppFVar17,false);
            }
            else {
              if ((toBlockContext->field_0x18 & 0x40) == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar16 = 1;
                bVar13 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                    ,0x145a,"(orgPred->isAirLockCompensationBlock)",
                                    "orgPred->isAirLockCompensationBlock");
                if (!bVar13) goto LAB_004246f5;
                *puVar16 = 0;
              }
              DecrementDataUseCount(pBVar27);
              toBlockContext->field_0x18 = toBlockContext->field_0x18 & 0xbf;
            }
            GlobOptBlockData::CloneBlockData(&toBlockContext->globOptData,toBlockContext,pBVar27);
            pBVar27 = toBlockContext;
          }
          pBVar29 = globOpt->tempBv;
          do {
            pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)pBVar29->head;
            if (pBVar29 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_00424000;
          } while (((Type *)&pBVar29->alloc)->word == 0);
          if (pBVar29 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
            GlobOpt::ToVar(globOpt,globOpt->tempBv,pBVar27,(Instr *)0x0);
          }
LAB_00424000:
          plVar30 = (long *)auStack_78;
          do {
            plVar30 = (long *)*plVar30;
            pJVar31 = (Type)auStack_158;
            if (plVar30 == (long *)0x0) goto LAB_00424033;
          } while (plVar30[2] == 0);
          if (plVar30 != (long *)0x0) {
            GlobOpt::ToInt32(globOpt,(BVSparse<Memory::JitArenaAllocator> *)auStack_78,pBVar27,true,
                             (Instr *)0x0);
          }
LAB_00424033:
          do {
            pJVar31 = (Type)(pJVar31->super_ArenaAllocator).
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            .super_Allocator.outOfMemoryFunc;
            if (pJVar31 == (Type)0x0) goto LAB_0042405b;
          } while ((pJVar31->super_ArenaAllocator).
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                   super_ArenaData.bigBlocks == (BigBlock *)0x0);
          if (pJVar31 != (Type)0x0) {
            GlobOpt::ToInt32(globOpt,(BVSparse<Memory::JitArenaAllocator> *)auStack_158,pBVar27,
                             false,(Instr *)0x0);
          }
LAB_0042405b:
          ppNVar32 = &__iter_1.current;
          do {
            ppNVar32 = &(*ppNVar32)->next;
            if (ppNVar32 == (NodeBase **)0x0) goto LAB_00424089;
          } while (((NodeBase *)(ppNVar32 + 2))->next == (Type)0x0);
          if (ppNVar32 != (NodeBase **)0x0) {
            GlobOpt::ToFloat64(globOpt,(BVSparse<Memory::JitArenaAllocator> *)&__iter_1.current,
                               pBVar27);
          }
LAB_00424089:
          if (symsRequiringCompensationToMergedValueInfoMap.size !=
              symsRequiringCompensationToMergedValueInfoMap.count) {
            GlobOpt::InsertValueCompensation(globOpt,pBVar27,this,(SymToValueInfoMap *)auStack_f8);
          }
        }
      }
      else {
        DecrementDataUseCount(pBVar48);
      }
    }
    symsNeedingLosslessIntConversion.lastUsedNodePrevNextField = (Type)pSVar1;
    __iter_1.list = &pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_004240e5:
    if (__iter_1.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar16 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                          ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar13) goto LAB_004246f5;
      *puVar16 = 0;
    }
    __iter_1.list =
         (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
         ((__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if (__iter_1.list !=
        (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
        symsNeedingLosslessIntConversion.lastUsedNodePrevNextField) {
      ppFVar17 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)&symsNeedingLosslessIntConversion.lastUsedNodePrevNextField)
      ;
      pBVar48 = (*ppFVar17)->predBlock;
      if (((this->field_0x18 & 4) == 0) || (this->loop != pBVar48->loop)) {
        if ((pBVar48->field_0x18 & 0x40) != 0) {
          DecrementDataUseCount(pBVar48);
          pSVar6 = (pBVar48->predList).
                   super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
          pSVar47 = &pBVar48->predList;
          if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar6 == pSVar47) ||
             ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar6->next != pSVar47)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x148c,"(pred->GetPredList()->HasOne())",
                                "pred->GetPredList()->HasOne()");
            if (!bVar13) goto LAB_004246f5;
            *puVar16 = 0;
          }
          ppFVar17 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (&pSVar47->
                                 super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
          pBVar48 = (*ppFVar17)->predBlock;
        }
        uVar15 = DecrementDataUseCount(pBVar48);
        if ((uVar15 == 0) &&
           ((pLVar4 = this->loop, pLVar4 == (Loop *)0x0 || (pLVar4->landingPad != pBVar48)))) {
          pSVar6 = (pBVar48->succList).
                   super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
          if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar6 != &pBVar48->succList)
             && ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar6->next ==
                 &pBVar48->succList)) {
            pSVar6 = (pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
            if ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar6 == pSVar1) {
              bVar13 = false;
            }
            else {
              bVar13 = (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar6->next ==
                       pSVar1;
            }
            if ((pLVar4 == (Loop *)0x0) && (bVar13)) {
              GlobOptBlockData::NullOutBlockData(&pBVar48->globOptData,globOpt,globOpt->func);
              goto LAB_004240e5;
            }
          }
          GlobOptBlockData::DeleteBlockData(&pBVar48->globOptData);
        }
      }
      goto LAB_004240e5;
    }
    pBVar29 = globOpt->tempBv;
    if (pBVar29->head != (Type_conflict)0x0) {
      pJVar31 = pBVar29->alloc;
      pBVar9 = pBVar29->head;
      pBVar43 = pJVar31->bvFreeList;
      do {
        pBVar35 = pBVar9;
        pBVar9 = pBVar35->next;
        pBVar35->next = pBVar43;
        pBVar43 = pBVar35;
      } while (pBVar9 != (Type)0x0);
      pJVar31->bvFreeList = pBVar35;
    }
    pBVar29->head = (Type_conflict)0x0;
    pBVar29->lastFoundIndex = (Type_conflict)0x0;
    pBVar29->lastUsedNodePrevNextField = &pBVar29->head;
    __iter_1.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    if (globOpt->prePassLoop != (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x149f,"(!globOpt->IsLoopPrePass())","!globOpt->IsLoopPrePass()");
      if (!bVar13) goto LAB_004246f5;
      *puVar16 = 0;
    }
    pLVar4 = this->loop;
    if ((this->field_0x18 & 4) == 0) {
      if (pLVar4 == (Loop *)0x0) {
        this->dataUseCount =
             (this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
             super_RealCount.count;
      }
      else if (pLVar4->dominatingLoopCountableBlock == this) {
        GlobOpt::DetermineLoopCount(globOpt,pLVar4);
      }
    }
    else {
      pBVar33 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,globOpt->alloc,0x3f1274);
      pJVar31 = globOpt->alloc;
      pBVar33->head = (Type_conflict)0x0;
      pBVar33->lastFoundIndex = (Type_conflict)0x0;
      pBVar33->alloc = pJVar31;
      pBVar33->lastUsedNodePrevNextField = (Type)pBVar33;
      pLVar4->varSymsOnEntry = pBVar33;
      pBVar29 = (this->globOptData).liveVarSyms;
      BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar29);
      BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
                (pBVar33,pBVar29->head);
      pBVar33 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,globOpt->alloc,0x3f1274);
      pJVar31 = globOpt->alloc;
      pBVar33->head = (Type_conflict)0x0;
      pBVar33->lastFoundIndex = (Type_conflict)0x0;
      pBVar33->alloc = pJVar31;
      pBVar33->lastUsedNodePrevNextField = (Type)pBVar33;
      pLVar4->int32SymsOnEntry = pBVar33;
      pBVar29 = (this->globOptData).liveInt32Syms;
      BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar29);
      BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
                (pBVar33,pBVar29->head);
      pBVar33 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,globOpt->alloc,0x3f1274);
      pJVar31 = globOpt->alloc;
      pBVar33->head = (Type_conflict)0x0;
      pBVar33->lastFoundIndex = (Type_conflict)0x0;
      pBVar33->alloc = pJVar31;
      pBVar33->lastUsedNodePrevNextField = (Type)pBVar33;
      pLVar4->lossyInt32SymsOnEntry = pBVar33;
      pBVar29 = (this->globOptData).liveLossyInt32Syms;
      BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar29);
      BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
                (pBVar33,pBVar29->head);
      pBVar33 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,globOpt->alloc,0x3f1274);
      pJVar31 = globOpt->alloc;
      pBVar33->head = (Type_conflict)0x0;
      pBVar33->lastFoundIndex = (Type_conflict)0x0;
      pBVar33->alloc = pJVar31;
      pBVar33->lastUsedNodePrevNextField = (Type)pBVar33;
      pLVar4->float64SymsOnEntry = pBVar33;
      pBVar29 = (this->globOptData).liveFloat64Syms;
      BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar29);
      BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
                (pBVar33,pBVar29->head);
      pBVar33 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,globOpt->alloc,0x3f1274);
      pJVar31 = globOpt->alloc;
      pBVar33->head = (Type_conflict)0x0;
      pBVar33->lastFoundIndex = (Type_conflict)0x0;
      pBVar33->alloc = pJVar31;
      pBVar33->lastUsedNodePrevNextField = (Type)pBVar33;
      pLVar4->liveFieldsOnEntry = pBVar33;
      pBVar29 = (this->globOptData).liveFields;
      BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar29);
      BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
                (pBVar33,pBVar29->head);
      if (symsRequiringCompensationToMergedValueInfoMap.size !=
          symsRequiringCompensationToMergedValueInfoMap.count) {
        this_03 = (BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *)new<Memory::JitArenaAllocator>(0x38,globOpt->alloc,0x3f1274);
        JsUtil::
        BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::BaseDictionary(this_03,globOpt->alloc,0);
        pLVar4->symsRequiringCompensationToMergedValueInfoMap = this_03;
        JsUtil::
        BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        DoCopy<JsUtil::BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
                  ((BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this_03,
                   (BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)auStack_f8);
      }
      bVar13 = GlobOpt::DoBoundCheckHoist(globOpt);
      if ((bVar13) && (pLVar4->inductionVariables != (InductionVariableSet *)0x0)) {
        GlobOpt::FinalizeInductionVariables(globOpt,pLVar4,(GlobOptBlockData *)&iter.last);
        bVar13 = GlobOpt::DoLoopCountBasedBoundCheckHoist(globOpt);
        if (bVar13) {
          GlobOpt::DetermineDominatingLoopCountableBlock(globOpt,pLVar4,this);
        }
      }
    }
    if (__iter_1.current != (NodeBase *)0x0) {
      pBVar9 = (Type)__iter_1.current;
      pBVar44 = pJVar3->bvFreeList;
      do {
        pBVar36 = pBVar9;
        pBVar9 = pBVar36->next;
        pBVar36->next = pBVar44;
        pBVar44 = pBVar36;
      } while (pBVar9 != (Type)0x0);
      pJVar3->bvFreeList = pBVar36;
    }
    if (auStack_158 != (undefined1  [8])0x0) {
      auVar49 = auStack_158;
      pVVar24 = *(ValueInfo **)&symsNeedingLosslessIntConversion.lastFoundIndex[5].startIndex;
      do {
        pVVar37 = (ValueInfo *)auVar49;
        auVar49 = (undefined1  [8])pVVar37->_vptr_ValueInfo;
        pVVar37->_vptr_ValueInfo = (_func_int **)pVVar24;
        pVVar24 = pVVar37;
      } while (auVar49 != (undefined1  [8])0x0);
      symsNeedingLosslessIntConversion.alloc = (Type)auStack_158;
      symsNeedingLosslessIntConversion.head = (Type_conflict)0x0;
      *(ValueInfo **)&symsNeedingLosslessIntConversion.lastFoundIndex[5].startIndex = pVVar37;
    }
    if (auStack_78 != (undefined1  [8])0x0) {
      auVar49 = auStack_78;
      pSVar45 = *(Sym **)&symsNeedingLossyIntConversion.lastFoundIndex[5].startIndex;
      do {
        pSVar38 = (Sym *)auVar49;
        auVar49 = (undefined1  [8])pSVar38->_vptr_Sym;
        pSVar38->_vptr_Sym = (_func_int **)pSVar45;
        pSVar45 = pSVar38;
      } while (auVar49 != (undefined1  [8])0x0);
      symsNeedingLossyIntConversion.alloc = (Type)auStack_78;
      symsNeedingLossyIntConversion.head = (Type_conflict)0x0;
      *(Sym **)&symsNeedingLossyIntConversion.lastFoundIndex[5].startIndex = pSVar38;
    }
    JsUtil::
    BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::~BaseDictionary((BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)auStack_f8);
  }
  else {
    if (this->loop == (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x1392,"(this->loop)","this->loop");
      if (!bVar13) goto LAB_004246f5;
      *puVar16 = 0;
    }
    bVar13 = GlobOpt::DoBoundCheckHoist(globOpt);
    if (bVar13) {
      GlobOpt::SetInductionVariableValueNumbers(globOpt,(GlobOptBlockData *)&iter.last);
    }
    if (((this->field_0x18 & 4) == 0) || (globOpt->rootLoopPrePass != this->loop))
    goto LAB_00424698;
    if (this->loop->bailOutInfo != (BailOutInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x139c,"(this->loop->bailOutInfo == nullptr)",
                          "this->loop->bailOutInfo == nullptr");
      if (!bVar13) goto LAB_004246f5;
      *puVar16 = 0;
    }
    pBVar19 = CreateLoopTopBailOutInfo(this,globOpt);
    this->loop->bailOutInfo = pBVar19;
  }
LAB_00424698:
  if (auStack_b8 == (undefined1  [8])0x0) {
    return;
  }
  p_Var39 = *(_func_void **)&symsRequiringCompensation.lastFoundIndex[5].startIndex;
  do {
    p_Var21 = (_func_void *)auStack_b8;
    auStack_b8 = *(undefined1 (*) [8])p_Var21;
    *(_func_void **)p_Var21 = p_Var39;
    p_Var39 = p_Var21;
  } while (auStack_b8 != (undefined1  [8])0x0);
  *(_func_void **)&symsRequiringCompensation.lastFoundIndex[5].startIndex = p_Var21;
  return;
code_r0x004231d1:
  pLVar34 = pBVar48->loop;
  bVar14 = pLVar34 != (Loop *)0x0;
  if (pLVar34 != pLVar4 && bVar14) {
    do {
      pLVar34 = pLVar34->parent;
      bVar14 = pLVar34 != (Loop *)0x0;
      if (pLVar34 == pLVar4) break;
    } while (pLVar34 != (Loop *)0x0);
  }
  if (bVar14) goto LAB_004230a3;
LAB_00423208:
  pPVar5 = (*ppFVar17)->pathDependentInfo;
  if (pPVar5 == (PathDependentInfo *)0x0) {
    infoToRestore = (PathDependentInfoToRestore)ZEXT816(0);
  }
  else {
    infoToRestore = GlobOpt::UpdatePathDependentInfo(globOpt,pPVar5);
  }
  if (pBVar48->dataUseCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar16 = 1;
    bVar14 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                        ,0x1359,"(pred->GetDataUseCount())","pred->GetDataUseCount()");
    if (!bVar14) goto LAB_004246f5;
    *puVar16 = 0;
  }
  if (iter.last == (NodeBase *)0x0) {
    pSVar6 = (pBVar48->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar6 != &pBVar48->succList) &&
       ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar6->next == &pBVar48->succList))
    {
      pSVar6 = (pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
               super_SListNodeBase<Memory::ArenaAllocator>.next;
      if ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar6 == pSVar1) {
        bVar14 = false;
      }
      else {
        bVar14 = (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar6->next == pSVar1;
      }
      if ((bVar14) && (this->loop == (Loop *)0x0)) {
        GlobOptBlockData::ReuseBlockData((GlobOptBlockData *)&iter.last,&pBVar48->globOptData);
        infoToRestore = (PathDependentInfoToRestore)ZEXT816(0);
        goto LAB_0042330f;
      }
    }
    GlobOptBlockData::CloneBlockData((GlobOptBlockData *)&iter.last,this,pBVar48);
  }
  else {
    bVar14 = globOpt->prePassLoop == (Loop *)0x0;
    pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    if (bVar14) {
      pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)auStack_b8;
    }
    pBVar33 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    if (bVar14) {
      pBVar33 = (BVSparse<Memory::JitArenaAllocator> *)auStack_f8;
    }
    GlobOptBlockData::MergeBlockData
              ((GlobOptBlockData *)&iter.last,this,pBVar48,pBVar29,pBVar33,bVar13);
    bVar13 = false;
  }
LAB_0042330f:
  if (pPVar5 != (PathDependentInfo *)0x0) {
    GlobOpt::RestorePathDependentInfo(globOpt,pPVar5,infoToRestore);
    pFVar7 = *ppFVar17;
    pJVar3 = globOpt->alloc;
    pPVar5 = pFVar7->pathDependentInfo;
    pPVar5->leftValue = (Value *)pJVar3->bvFreeList;
    pJVar3->bvFreeList = (BVSparseNode *)pPVar5;
    pFVar7->pathDependentInfo = (PathDependentInfo *)0x0;
  }
  goto LAB_004230a3;
}

Assistant:

void
BasicBlock::MergePredBlocksValueMaps(GlobOpt* globOpt)
{
    Assert(!globOpt->isCallHelper);
    // We keep a local temporary copy for the merge
    GlobOptBlockData blockData(this->globOptData.curFunc);

    if (!globOpt->isRecursiveCallOnLandingPad)
    {
        blockData.NullOutBlockData(globOpt, globOpt->func);
    }
    else
    {
        // If we are going over the landing pad again after field PRE, just start again
        // with the value table where we left off.
        blockData.CopyBlockData(&this->globOptData);
        return;
    }

    BVSparse<JitArenaAllocator> symsRequiringCompensation(globOpt->tempAlloc);
    {
        BVSparse<JitArenaAllocator> symsCreatedForMerge(globOpt->tempAlloc);
        bool forceTypeSpecOnLoopHeader = true;
        FOREACH_PREDECESSOR_BLOCK(pred, this)
        {
            if (pred->globOptData.callSequence && pred->globOptData.callSequence->Empty())
            {
                JitAdelete(globOpt->alloc, pred->globOptData.callSequence);
                pred->globOptData.callSequence = nullptr;
            }
            if (this->isLoopHeader && globOpt->IsLoopPrePass() && globOpt->prePassLoop == this->loop && this->loop->IsDescendentOrSelf(pred->loop))
            {
                // Loop back-edge.
                // First pass on loop runs optimistically, without doing transforms.
                // Skip this edge for now.
                continue;
            }

            PathDependentInfo *const pathDependentInfo = __edge->GetPathDependentInfo();
            PathDependentInfoToRestore pathDependentInfoToRestore;
            if (pathDependentInfo)
            {
                pathDependentInfoToRestore = globOpt->UpdatePathDependentInfo(pathDependentInfo);
            }

            Assert(pred->GetDataUseCount());

            // First pred?
            if (blockData.symToValueMap == nullptr)
            {
                // Only one edge?
                if (pred->GetSuccList()->HasOne() && this->GetPredList()->HasOne() && this->loop == nullptr)
                {
                    blockData.ReuseBlockData(&pred->globOptData);

                    // Don't need to restore the old value info
                    pathDependentInfoToRestore.Clear();
                }
                else
                {
                    blockData.CloneBlockData(this, pred);
                }
            }
            else
            {
                const bool isLoopPrePass = globOpt->IsLoopPrePass();
                blockData.MergeBlockData(
                    this,
                    pred,
                    isLoopPrePass ? nullptr : &symsRequiringCompensation,
                    isLoopPrePass ? nullptr : &symsCreatedForMerge,
                    forceTypeSpecOnLoopHeader);
                forceTypeSpecOnLoopHeader = false; // can force type-spec on the loop header only for the first back edge.
            }

            // Restore the value for the next edge
            if (pathDependentInfo)
            {
                globOpt->RestorePathDependentInfo(pathDependentInfo, pathDependentInfoToRestore);
                __edge->ClearPathDependentInfo(globOpt->alloc);
            }

        } NEXT_PREDECESSOR_BLOCK;
    }

    // Consider: We can recreate values for hoisted field so it can copy prop out of the loop
    if (blockData.symToValueMap == nullptr)
    {
        blockData.InitBlockData(globOpt, globOpt->func);
    }

    if (!globOpt->DoObjTypeSpec())
    {
        // Object type specialization is off, but if copy prop is on (e.g., /force:fieldhoist) we're not clearing liveFields,
        // so we may be letting type syms slip through this block.
        globOpt->KillAllObjectTypes(this->globOptData.liveFields);
    }

    this->globOptData.CopyBlockData(&blockData);

    if (globOpt->IsLoopPrePass())
    {
        Assert(this->loop);

        if(globOpt->DoBoundCheckHoist())
        {
            globOpt->SetInductionVariableValueNumbers(&blockData);
        }

        if (this->isLoopHeader && globOpt->rootLoopPrePass == this->loop)
        {
            // Capture bail out info in case we have optimization that needs it
            Assert(this->loop->bailOutInfo == nullptr);
            this->loop->bailOutInfo = this->CreateLoopTopBailOutInfo(globOpt);
        }

        // If loop pre-pass, don't insert convert from type-spec to var
        return;
    }

    this->CleanUpValueMaps();
    Sym *symIV = nullptr;

    // Clean up the syms requiring compensation by checking the final value in the merged block to see if the sym still requires
    // compensation. All the while, create a mapping from sym to value info in the merged block. This dictionary helps avoid a
    // value lookup in the merged block per predecessor.
    SymToValueInfoMap symsRequiringCompensationToMergedValueInfoMap(globOpt->tempAlloc);
    if(!symsRequiringCompensation.IsEmpty())
    {
        const SymTable *const symTable = func->m_symTable;
        FOREACH_BITSET_IN_SPARSEBV(id, &symsRequiringCompensation)
        {
            Sym *const sym = symTable->Find(id);
            Assert(sym);

            Value *const value = blockData.FindValue(sym);
            if(!value)
            {
                continue;
            }

            ValueInfo *const valueInfo = value->GetValueInfo();
            if(!valueInfo->IsArrayValueInfo())
            {
                continue;
            }

            // At least one new sym was created while merging and associated with the merged value info, so those syms will
            // require compensation in predecessors. For now, the dead store phase is relied upon to remove compensation that is
            // dead due to no further uses of the new sym.
            symsRequiringCompensationToMergedValueInfoMap.Add(sym, valueInfo);
        } NEXT_BITSET_IN_SPARSEBV;
        symsRequiringCompensation.ClearAll();
    }

    if (this->isLoopHeader)
    {
        BVSparse<JitArenaAllocator> * tempBv = globOpt->tempBv;
        // Values on the back-edge in the prepass may be conservative for syms defined in the loop, and type specialization in
        // the prepass is not reflective of the value, but rather, is used to determine whether the sym should be specialized
        // around the loop. Additionally, some syms that are used before defined in the loop may be specialized in the loop
        // header despite not being specialized in the landing pad. Now that the type specialization bit-vectors are merged,
        // specialize the corresponding value infos in the loop header too.

        Assert(tempBv->IsEmpty());
        Loop *const loop = this->loop;
        SymTable *const symTable = func->m_symTable;
        JitArenaAllocator *const alloc = globOpt->alloc;

        // Int-specialized syms
        tempBv->Or(loop->likelyIntSymsUsedBeforeDefined, loop->symsDefInLoop);
        tempBv->And(blockData.liveInt32Syms);
        tempBv->Minus(blockData.liveLossyInt32Syms);
        FOREACH_BITSET_IN_SPARSEBV(id, tempBv)
        {
            StackSym *const varSym = symTable->FindStackSym(id);
            Assert(varSym);
            Value *const value = blockData.FindValue(varSym);
            Assert(value);
            ValueInfo *const valueInfo = value->GetValueInfo();
            if(!valueInfo->IsInt())
            {
                globOpt->ChangeValueInfo(nullptr, value, valueInfo->SpecializeToInt32(alloc));
            }
        } NEXT_BITSET_IN_SPARSEBV;

        // Float-specialized syms
        tempBv->Or(loop->likelyNumberSymsUsedBeforeDefined, loop->symsDefInLoop);
        tempBv->Or(loop->forceFloat64SymsOnEntry);
        tempBv->And(blockData.liveFloat64Syms);
        GlobOptBlockData &landingPadBlockData = loop->landingPad->globOptData;
        FOREACH_BITSET_IN_SPARSEBV(id, tempBv)
        {
            StackSym *const varSym = symTable->FindStackSym(id);
            Assert(varSym);

            // If the type-spec sym is null or if the sym is not float-specialized in the loop landing pad, the sym may have
            // been merged to float on a loop back-edge when it was live as float on the back-edge, and live as int in the loop
            // header. In this case, compensation inserted in the loop landing pad will use BailOutNumberOnly, and so it is
            // guaranteed that the value will be float. Otherwise, if the type-spec sym exists, its field can be checked to see
            // if it's prevented from being anything but a number.
            StackSym *const typeSpecSym = varSym->GetFloat64EquivSym(nullptr);
            if(!typeSpecSym ||
                typeSpecSym->m_requiresBailOnNotNumber ||
                !landingPadBlockData.IsFloat64TypeSpecialized(varSym))
            {
                Value *const value = blockData.FindValue(varSym);
                if(value)
                {
                    ValueInfo *const valueInfo = value->GetValueInfo();
                    if(!valueInfo->IsNumber())
                    {
                        globOpt->ChangeValueInfo(this, value, valueInfo->SpecializeToFloat64(alloc));
                    }
                }
                else
                {
                    this->globOptData.SetValue(globOpt->NewGenericValue(ValueType::Float), varSym);
                }
            }
        } NEXT_BITSET_IN_SPARSEBV;
        tempBv->ClearAll();
    }

    // We need to handle the case where a symbol is type-spec'd coming from some predecessors,
    // but not from others.
    //
    // We can do this by inserting the right conversion in the predecessor block, but we
    // can only do this if we are the first successor of that block, since the previous successors
    // would have already been processed.  Instead, we'll need to break the edge and insert a block
    // (airlock block) to put in the conversion code.
    Assert(globOpt->tempBv->IsEmpty());

    BVSparse<JitArenaAllocator> symsNeedingLossyIntConversion(globOpt->tempAlloc);
    BVSparse<JitArenaAllocator> symsNeedingLosslessIntConversion(globOpt->tempAlloc);
    BVSparse<JitArenaAllocator> symsNeedingFloatConversion(globOpt->tempAlloc);

    FOREACH_PREDECESSOR_EDGE_EDITING(edge, this, iter)
    {
        BasicBlock *pred = edge->GetPred();

        if (pred->loop && pred->loop->GetHeadBlock() == this)
        {
            pred->DecrementDataUseCount();
            // Skip loop back-edges. We will handle these when we get to the exit blocks.
            continue;
        }

        BasicBlock *orgPred = nullptr;
        if (pred->isAirLockCompensationBlock)
        {
            Assert(pred->GetPredList()->HasOne());
            orgPred = pred;
            pred = (pred->GetPredList()->Head())->GetPred();
        }

        // Lossy int in the merged block, and no int in the predecessor - need a lossy conversion to int
        symsNeedingLossyIntConversion.Minus(blockData.liveLossyInt32Syms, pred->globOptData.liveInt32Syms);

        // Lossless int in the merged block, and no lossless int in the predecessor - need a lossless conversion to int
        symsNeedingLosslessIntConversion.Minus(blockData.liveInt32Syms, blockData.liveLossyInt32Syms);
        globOpt->tempBv->Minus(pred->globOptData.liveInt32Syms, pred->globOptData.liveLossyInt32Syms);
        symsNeedingLosslessIntConversion.Minus(globOpt->tempBv);

        globOpt->tempBv->Minus(blockData.liveVarSyms, pred->globOptData.liveVarSyms);
        symsNeedingFloatConversion.Minus(blockData.liveFloat64Syms, pred->globOptData.liveFloat64Syms);

        bool symIVNeedsSpecializing = (symIV && !pred->globOptData.liveInt32Syms->Test(symIV->m_id) && !symsNeedingLosslessIntConversion.Test(symIV->m_id));

        if (!globOpt->tempBv->IsEmpty() ||
            !symsNeedingLossyIntConversion.IsEmpty() ||
            !symsNeedingLosslessIntConversion.IsEmpty() ||
            !symsNeedingFloatConversion.IsEmpty() ||
            symIVNeedsSpecializing ||
            symsRequiringCompensationToMergedValueInfoMap.Count() != 0)
        {
            // We can't un-specialize a symbol in a predecessor if we've already processed
            // a successor of that block. Instead, insert a new block on the flow edge
            // (an airlock block) and do the un-specialization there.
            //
            // Alternatively, the current block could be an exit block out of this loop, and so the predecessor may exit the
            // loop. In that case, if the predecessor may continue into the loop without exiting, then we need an airlock block
            // to do the appropriate conversions only on the exit path (preferring not to do the conversions inside the loop).
            // If, on the other hand, the predecessor always flows into the current block, then it always exits, so we don't need
            // an airlock block and can just do the conversions in the predecessor.
            if (pred->GetSuccList()->Head()->GetSucc() != this||
                (pred->loop && pred->loop->parent == this->loop && pred->GetSuccList()->Count() > 1))
            {
                BasicBlock *airlockBlock = nullptr;
                if (!orgPred)
                {
                    if (PHASE_TRACE(Js::GlobOptPhase, this->func) && !globOpt->IsLoopPrePass())
                    {
                        Output::Print(_u("TRACE: "));
                        Output::Print(_u("Inserting airlock block to convert syms to var between block %d and %d\n"),
                            pred->GetBlockNum(), this->GetBlockNum());
                        Output::Flush();
                    }
                    airlockBlock = globOpt->func->m_fg->InsertAirlockBlock(edge);
                }
                else
                {
                    Assert(orgPred->isAirLockCompensationBlock);
                    airlockBlock = orgPred;
                    pred->DecrementDataUseCount();
                    airlockBlock->isAirLockCompensationBlock = false; // This is airlock block now. So remove the attribute.
                }
                globOpt->CloneBlockData(airlockBlock, pred);

                pred = airlockBlock;
            }
            if (!globOpt->tempBv->IsEmpty())
            {
                globOpt->ToVar(globOpt->tempBv, pred);
            }
            if (!symsNeedingLossyIntConversion.IsEmpty())
            {
                globOpt->ToInt32(&symsNeedingLossyIntConversion, pred, true /* lossy */);
            }
            if (!symsNeedingLosslessIntConversion.IsEmpty())
            {
                globOpt->ToInt32(&symsNeedingLosslessIntConversion, pred, false /* lossy */);
            }
            if (!symsNeedingFloatConversion.IsEmpty())
            {
                globOpt->ToFloat64(&symsNeedingFloatConversion, pred);
            }
            if (symIVNeedsSpecializing)
            {
                globOpt->tempBv->ClearAll();
                globOpt->tempBv->Set(symIV->m_id);
                globOpt->ToInt32(globOpt->tempBv, pred, false /* lossy */);
            }
            if(symsRequiringCompensationToMergedValueInfoMap.Count() != 0)
            {
                globOpt->InsertValueCompensation(pred, this, &symsRequiringCompensationToMergedValueInfoMap);
            }
        }
    } NEXT_PREDECESSOR_EDGE_EDITING;

    FOREACH_PREDECESSOR_EDGE(edge, this)
    {
        // Peak Memory optimization:
        // These are in an arena, but putting them on the free list greatly reduces
        // the peak memory used by the global optimizer for complex flow graphs.
        BasicBlock *pred = edge->GetPred();
        if (!this->isLoopHeader || this->loop != pred->loop)
        {
            // Skip airlock compensation block as we are not going to walk this block.
            if (pred->isAirLockCompensationBlock)
            {
                pred->DecrementDataUseCount();
                Assert(pred->GetPredList()->HasOne());
                pred = (pred->GetPredList()->Head())->GetPred();
            }

            if (pred->DecrementDataUseCount() == 0 && (!this->loop || this->loop->landingPad != pred))
            {
                if (!(pred->GetSuccList()->HasOne() && this->GetPredList()->HasOne() && this->loop == nullptr))
                {
                    pred->globOptData.DeleteBlockData();
                }
                else
                {
                    pred->globOptData.NullOutBlockData(globOpt, globOpt->func);
                }
            }
        }
    } NEXT_PREDECESSOR_EDGE;

    globOpt->tempBv->ClearAll();
    Assert(!globOpt->IsLoopPrePass());   // We already early return if we are in prepass

    if (this->isLoopHeader)
    {
        Loop *const loop = this->loop;

        // Save values live on loop entry, such that we can adjust the state of the
        // values on the back-edge to match.
        loop->varSymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->varSymsOnEntry->Copy(this->globOptData.liveVarSyms);

        loop->int32SymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->int32SymsOnEntry->Copy(this->globOptData.liveInt32Syms);

        loop->lossyInt32SymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->lossyInt32SymsOnEntry->Copy(this->globOptData.liveLossyInt32Syms);

        loop->float64SymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->float64SymsOnEntry->Copy(this->globOptData.liveFloat64Syms);

        loop->liveFieldsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->liveFieldsOnEntry->Copy(this->globOptData.liveFields);

        if (symsRequiringCompensationToMergedValueInfoMap.Count() != 0)
        {
            loop->symsRequiringCompensationToMergedValueInfoMap = JitAnew(globOpt->alloc, SymToValueInfoMap, globOpt->alloc);
            loop->symsRequiringCompensationToMergedValueInfoMap->Copy(&symsRequiringCompensationToMergedValueInfoMap);
        }
        
        if(globOpt->DoBoundCheckHoist() && loop->inductionVariables)
        {
            globOpt->FinalizeInductionVariables(loop, &blockData);
            if(globOpt->DoLoopCountBasedBoundCheckHoist())
            {
                globOpt->DetermineDominatingLoopCountableBlock(loop, this);
            }
        }
    }
    else if (!this->loop)
    {
        this->SetDataUseCount(this->GetSuccList()->Count());
    }
    else if(this == this->loop->dominatingLoopCountableBlock)
    {
        globOpt->DetermineLoopCount(this->loop);
    }
}